

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O0

int graph_5_4::dfs_traverse(m_graph g)

{
  code *pcVar1;
  int v;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  m_graph in_stack_fffffffffffffc58;
  undefined8 local_1d0 [56];
  int local_10;
  int local_c;
  int j;
  int i;
  
  bVar5 = 0;
  for (local_c = 0; local_c < g.vexs[8]; local_c = local_c + 1) {
    *(undefined4 *)(visited + (long)local_c * 4) = 0;
  }
  for (local_10 = 0; local_10 < g.vexs[8]; local_10 = local_10 + 1) {
    if (*(int *)(visited + (long)local_10 * 4) == 0) {
      memcpy(local_1d0,&stack0x00000008,0x1c0);
      v = local_10;
      puVar3 = local_1d0;
      puVar4 = (undefined8 *)&stack0xfffffffffffffc58;
      for (lVar2 = 0x38; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
        puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      }
      dfs(in_stack_fffffffffffffc58,v);
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int dfs_traverse(m_graph g) {
        for (int i = 0; i < g.vnum; i++)
            visited[i] = 0;

        for (int j = 0; j < g.vnum; j++) {
            if (visited[j] == 0)
                dfs(g, j);
        }
    }